

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

int __thiscall QTreeViewPrivate::coordinateForItem(QTreeViewPrivate *this,int item)

{
  int iVar1;
  uint item_00;
  long lVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  if ((this->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerPixel) {
    if (this->uniformRowHeights != false) {
      iVar3 = this->defaultItemHeight;
      iVar1 = QAbstractSlider::value
                        (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                          vbar)->super_QAbstractSlider);
      return item * iVar3 - iVar1;
    }
    if ((this->viewItems).d.size != 0) {
      uVar4 = 0;
      iVar3 = 0;
      do {
        if ((uint)item == uVar4) {
          iVar1 = QAbstractSlider::value
                            (&((this->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.vbar)->super_QAbstractSlider);
          return iVar3 - iVar1;
        }
        iVar1 = itemHeight(this,(int)uVar4);
        iVar3 = iVar3 + iVar1;
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)(this->viewItems).d.size);
    }
  }
  else {
    item_00 = QAbstractSlider::value
                        (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                          vbar)->super_QAbstractSlider);
    if (this->uniformRowHeights == true) {
      return (item - item_00) * this->defaultItemHeight;
    }
    if ((int)item_00 <= item) {
      if (item == item_00) {
        return 0;
      }
      lVar2 = (long)(int)item_00;
      if ((this->viewItems).d.size <= lVar2) {
        return 0;
      }
      iVar3 = 0;
      do {
        lVar2 = lVar2 + 1;
        iVar1 = itemHeight(this,item_00);
        iVar3 = iVar1 + iVar3;
        if (item - 1U == item_00) {
          return iVar3;
        }
        item_00 = item_00 + 1;
      } while (lVar2 < (this->viewItems).d.size);
      return iVar3;
    }
    if (0 < (int)item_00) {
      iVar3 = 0;
      do {
        iVar1 = itemHeight(this,item_00 - 1);
        iVar3 = iVar3 - iVar1;
        if (item_00 < 2) {
          return iVar3;
        }
        bVar5 = item + 1U != item_00;
        item_00 = item_00 - 1;
      } while (bVar5);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

int QTreeViewPrivate::coordinateForItem(int item) const
{
    if (verticalScrollMode == QAbstractItemView::ScrollPerPixel) {
        if (uniformRowHeights)
            return (item * defaultItemHeight) - vbar->value();
        // ### optimize (maybe do like QHeaderView by letting items have startposition)
        int y = 0;
        for (int i = 0; i < viewItems.size(); ++i) {
            if (i == item)
                return y - vbar->value();
            y += itemHeight(i);
        }
    } else { // ScrollPerItem
        int topViewItemIndex = vbar->value();
        if (uniformRowHeights)
            return defaultItemHeight * (item - topViewItemIndex);
        if (item >= topViewItemIndex) {
            // search in the visible area first and continue down
            // ### slow if the item is not visible
            int viewItemCoordinate = 0;
            int viewItemIndex = topViewItemIndex;
            while (viewItemIndex < viewItems.size()) {
                if (viewItemIndex == item)
                    return viewItemCoordinate;
                viewItemCoordinate += itemHeight(viewItemIndex);
                ++viewItemIndex;
            }
            // below the last item in the view
            Q_ASSERT(false);
            return viewItemCoordinate;
        } else {
            // search the area above the viewport (used for editor widgets)
            int viewItemCoordinate = 0;
            for (int viewItemIndex = topViewItemIndex; viewItemIndex > 0; --viewItemIndex) {
                if (viewItemIndex == item)
                    return viewItemCoordinate;
                viewItemCoordinate -= itemHeight(viewItemIndex - 1);
            }
            return viewItemCoordinate;
        }
    }
    return 0;
}